

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

void * mspace_realloc(mspace msp,void *oldmem,size_t bytes)

{
  int *piVar1;
  mchunkptr pmVar2;
  ulong uVar3;
  long lVar4;
  size_t local_70;
  size_t local_58;
  size_t oc;
  mchunkptr newp;
  mstate m;
  mchunkptr oldp;
  size_t nb;
  void *mem;
  size_t bytes_local;
  void *oldmem_local;
  mspace msp_local;
  
  nb = 0;
  if (oldmem == (void *)0x0) {
    nb = (size_t)mspace_malloc(msp,bytes);
  }
  else if (bytes < 0xffffffffffffff80) {
    if (bytes < 0x17) {
      local_58 = 0x20;
    }
    else {
      local_58 = bytes + 0x17 & 0xfffffffffffffff0;
    }
    pmVar2 = try_realloc_chunk((mstate)msp,(mchunkptr)((long)oldmem + -0x10),local_58,1);
    if (pmVar2 == (mchunkptr)0x0) {
      nb = (size_t)mspace_malloc(msp,bytes);
      if ((void *)nb != (void *)0x0) {
        lVar4 = 8;
        if ((*(ulong *)((long)oldmem + -8) & 3) == 0) {
          lVar4 = 0x10;
        }
        uVar3 = (*(ulong *)((long)oldmem + -8) & 0xfffffffffffffff8) - lVar4;
        local_70 = bytes;
        if (uVar3 < bytes) {
          local_70 = uVar3;
        }
        memcpy((void *)nb,oldmem,local_70);
        mspace_free(msp,oldmem);
      }
    }
    else {
      nb = (size_t)&pmVar2->fd;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  return (void *)nb;
}

Assistant:

void* mspace_realloc(mspace msp, void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem == 0) {
    mem = mspace_malloc(msp, bytes);
  }
  else if (bytes >= MAX_REQUEST) {
    MALLOC_FAILURE_ACTION;
  }
#ifdef REALLOC_ZERO_BYTES_FREES
  else if (bytes == 0) {
    mspace_free(msp, oldmem);
  }
#endif /* REALLOC_ZERO_BYTES_FREES */
  else {
    size_t nb = request2size(bytes);
    mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
    mstate m = (mstate)msp;
#else /* FOOTERS */
    mstate m = get_mstate_for(oldp);
    if (!ok_magic(m)) {
      USAGE_ERROR_ACTION(m, oldmem);
      return 0;
    }
#endif /* FOOTERS */
    if (!PREACTION(m)) {
      mchunkptr newp = try_realloc_chunk(m, oldp, nb, 1);
      POSTACTION(m);
      if (newp != 0) {
        check_inuse_chunk(m, newp);
        mem = chunk2mem(newp);
      }
      else {
        mem = mspace_malloc(m, bytes);
        if (mem != 0) {
          size_t oc = chunksize(oldp) - overhead_for(oldp);
          memcpy(mem, oldmem, (oc < bytes)? oc : bytes);
          mspace_free(m, oldmem);
        }
      }
    }
  }
  return mem;
}